

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMarkers.cpp
# Opt level: O1

void __thiscall chrono::ChLinkMarkers::ConstraintsFbLoadForces(ChLinkMarkers *this,double factor)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  ChBodyFrame *pCVar50;
  ChMarker *pCVar51;
  int iVar52;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Index index;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  double dVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  Vector mbody_force;
  Vector mbody_torque;
  Vector m_abs_force;
  ChVector<double> local_a8;
  ChVectorRef local_90;
  ChVector<double> local_78;
  ulong local_58;
  double local_50;
  ulong local_48;
  ChVectorRef local_40;
  ChVector<double> local_28;
  
  if (((this->super_ChLink).Body1 != (ChBodyFrame *)0x0) &&
     (pCVar50 = (this->super_ChLink).Body2, pCVar50 != (ChBodyFrame *)0x0)) {
    dVar81 = (this->C_force).m_data[0];
    auVar89._8_8_ = 0;
    auVar89._0_8_ = dVar81;
    dVar1 = (this->C_force).m_data[1];
    if ((dVar81 != 0.0) ||
       ((((NAN(dVar81) || (dVar1 != 0.0)) || (NAN(dVar1))) ||
        ((dVar81 = (this->C_force).m_data[2], dVar81 != 0.0 || (NAN(dVar81))))))) {
      local_a8.m_data[0] = 0.0;
      local_a8.m_data[1] = 0.0;
      local_a8.m_data[2] = 0.0;
      local_78.m_data[2] = 0.0;
      local_78.m_data[0] = 0.0;
      local_78.m_data[1] = 0.0;
      pCVar51 = this->marker2;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[0];
      auVar68._8_8_ = 0;
      auVar68._0_8_ =
           dVar1 * (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
      auVar2 = vfmadd231sd_fma(auVar68,auVar89,auVar2);
      auVar74._8_8_ = 0;
      auVar74._0_8_ = (this->C_force).m_data[2];
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[2];
      auVar2 = vfmadd231sd_fma(auVar2,auVar74,auVar3);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[3];
      auVar82._8_8_ = 0;
      auVar82._0_8_ =
           dVar1 * (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4];
      auVar3 = vfmadd231sd_fma(auVar82,auVar89,auVar4);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[5];
      auVar3 = vfmadd231sd_fma(auVar3,auVar74,auVar5);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[6];
      auVar62._8_8_ = 0;
      auVar62._0_8_ =
           dVar1 * (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[7];
      auVar89 = vfmadd231sd_fma(auVar62,auVar89,auVar6);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8];
      auVar89 = vfmadd231sd_fma(auVar89,auVar74,auVar7);
      dVar81 = auVar3._0_8_;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[0];
      auVar56._8_8_ = 0;
      auVar56._0_8_ =
           dVar81 * (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[1];
      auVar3 = vfmadd231sd_fma(auVar56,auVar2,auVar8);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[2];
      auVar3 = vfmadd231sd_fma(auVar3,auVar89,auVar9);
      auVar10._8_8_ = 0;
      auVar10._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      auVar75._8_8_ = 0;
      auVar75._0_8_ =
           dVar81 * (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[4];
      auVar4 = vfmadd231sd_fma(auVar75,auVar2,auVar10);
      auVar11._8_8_ = 0;
      auVar11._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      auVar4 = vfmadd231sd_fma(auVar4,auVar89,auVar11);
      auVar12._8_8_ = 0;
      auVar12._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      auVar83._8_8_ = 0;
      auVar83._0_8_ =
           dVar81 * (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[7];
      auVar2 = vfmadd231sd_fma(auVar83,auVar2,auVar12);
      auVar13._8_8_ = 0;
      auVar13._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      auVar89 = vfmadd231sd_fma(auVar2,auVar89,auVar13);
      local_28.m_data[0] = auVar3._0_8_;
      local_28.m_data[1] = auVar4._0_8_;
      local_28.m_data[2] = auVar89._0_8_;
      ChBodyFrame::To_abs_forcetorque
                (pCVar50,&local_28,&(this->marker1->abs_frame).super_ChFrame<double>.coord.pos,false
                 ,&local_a8,&local_78);
      iVar52 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                 _vptr_ChFrame[0x10])();
      ChVariables::Get_fb(&local_90,(ChVariables *)CONCAT44(extraout_var,iVar52));
      if ((long)local_90.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ._8_8_ < 3) goto LAB_0058be27;
      uVar53 = 3;
      if (((local_90.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ & 7) == 0) &&
         (uVar54 = (ulong)(-((uint)((ulong)local_90.
                                           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                           ._0_8_ >> 3) & 0x1fffffff) & 7), uVar54 < 3)) {
        uVar53 = uVar54;
      }
      if (uVar53 != 0) {
        uVar54 = 0;
        do {
          *(double *)
           (local_90.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ + uVar54 * 8) =
               *(double *)
                (local_90.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + uVar54 * 8) - factor * local_a8.m_data[uVar54];
          uVar54 = uVar54 + 1;
        } while (uVar53 != uVar54);
      }
      if (uVar53 < 3) {
        do {
          *(double *)
           (local_90.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ + uVar53 * 8) =
               *(double *)
                (local_90.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + uVar53 * 8) - factor * local_a8.m_data[uVar53];
          uVar53 = uVar53 + 1;
        } while (uVar53 != 3);
      }
      pCVar50 = (this->super_ChLink).Body2;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = local_78.m_data[0];
      auVar14._8_8_ = 0;
      auVar14._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      auVar69._8_8_ = 0;
      auVar69._0_8_ =
           local_78.m_data[1] *
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      auVar89 = vfmadd231sd_fma(auVar69,auVar57,auVar14);
      auVar76._8_8_ = 0;
      auVar76._0_8_ = local_78.m_data[2];
      auVar15._8_8_ = 0;
      auVar15._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      auVar89 = vfmadd231sd_fma(auVar89,auVar76,auVar15);
      auVar16._8_8_ = 0;
      auVar16._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      auVar84._8_8_ = 0;
      auVar84._0_8_ =
           local_78.m_data[1] *
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      auVar2 = vfmadd231sd_fma(auVar84,auVar57,auVar16);
      auVar17._8_8_ = 0;
      auVar17._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
      auVar2 = vfmadd231sd_fma(auVar2,auVar76,auVar17);
      auVar18._8_8_ = 0;
      auVar18._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      auVar63._8_8_ = 0;
      auVar63._0_8_ =
           local_78.m_data[1] *
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      auVar3 = vfmadd231sd_fma(auVar63,auVar57,auVar18);
      auVar19._8_8_ = 0;
      auVar19._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      auVar3 = vfmadd231sd_fma(auVar3,auVar76,auVar19);
      local_90.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
      _0_8_ = auVar89._0_8_;
      local_90.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
      _8_8_ = auVar2._0_8_;
      local_90.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
      _16_8_ = auVar3._0_8_;
      iVar52 = (*(pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])()
      ;
      ChVariables::Get_fb(&local_40,(ChVariables *)CONCAT44(extraout_var_00,iVar52));
      if ((long)local_40.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ._8_8_ < 6) goto LAB_0058be27;
      uVar54 = local_40.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._0_8_ + 0x18;
      uVar53 = 3;
      if (((uVar54 & 7) == 0) &&
         (uVar55 = (ulong)(-((uint)(uVar54 >> 3) & 0x1fffffff) & 7), uVar55 < 3)) {
        uVar53 = uVar55;
      }
      if (uVar53 != 0) {
        uVar55 = 0;
        do {
          *(double *)(uVar54 + uVar55 * 8) =
               *(double *)(uVar54 + uVar55 * 8) -
               factor * *(double *)
                         (&local_90.
                           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                           .field_0x0 + uVar55 * 8);
          uVar55 = uVar55 + 1;
        } while (uVar53 != uVar55);
      }
      if (uVar53 < 3) {
        do {
          *(double *)(uVar54 + uVar53 * 8) =
               *(double *)(uVar54 + uVar53 * 8) -
               factor * *(double *)
                         (&local_90.
                           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                           .field_0x0 + uVar53 * 8);
          uVar53 = uVar53 + 1;
        } while (uVar53 != 3);
      }
      ChBodyFrame::To_abs_forcetorque
                ((this->super_ChLink).Body1,&local_28,
                 &(this->marker1->abs_frame).super_ChFrame<double>.coord.pos,false,&local_a8,
                 &local_78);
      iVar52 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
                 _vptr_ChFrame[0x10])();
      ChVariables::Get_fb(&local_90,(ChVariables *)CONCAT44(extraout_var_01,iVar52));
      if ((long)local_90.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ._8_8_ < 3) goto LAB_0058be27;
      uVar53 = 3;
      if (((local_90.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ & 7) == 0) &&
         (uVar54 = (ulong)(-((uint)((ulong)local_90.
                                           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                                           ._0_8_ >> 3) & 0x1fffffff) & 7), uVar54 < 3)) {
        uVar53 = uVar54;
      }
      if (uVar53 != 0) {
        uVar54 = 0;
        do {
          *(double *)
           (local_90.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ + uVar54 * 8) =
               factor * local_a8.m_data[uVar54] +
               *(double *)
                (local_90.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + uVar54 * 8);
          uVar54 = uVar54 + 1;
        } while (uVar53 != uVar54);
      }
      if (uVar53 < 3) {
        do {
          *(double *)
           (local_90.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ + uVar53 * 8) =
               factor * local_a8.m_data[uVar53] +
               *(double *)
                (local_90.
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                 ._0_8_ + uVar53 * 8);
          uVar53 = uVar53 + 1;
        } while (uVar53 != 3);
      }
      pCVar50 = (this->super_ChLink).Body1;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = local_78.m_data[0];
      auVar20._8_8_ = 0;
      auVar20._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      auVar70._8_8_ = 0;
      auVar70._0_8_ =
           local_78.m_data[1] *
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      auVar89 = vfmadd231sd_fma(auVar70,auVar58,auVar20);
      auVar77._8_8_ = 0;
      auVar77._0_8_ = local_78.m_data[2];
      auVar21._8_8_ = 0;
      auVar21._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      auVar89 = vfmadd231sd_fma(auVar89,auVar77,auVar21);
      auVar22._8_8_ = 0;
      auVar22._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      auVar85._8_8_ = 0;
      auVar85._0_8_ =
           local_78.m_data[1] *
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      auVar2 = vfmadd231sd_fma(auVar85,auVar58,auVar22);
      auVar23._8_8_ = 0;
      auVar23._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
      auVar2 = vfmadd231sd_fma(auVar2,auVar77,auVar23);
      auVar24._8_8_ = 0;
      auVar24._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      auVar64._8_8_ = 0;
      auVar64._0_8_ =
           local_78.m_data[1] *
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      auVar3 = vfmadd231sd_fma(auVar64,auVar58,auVar24);
      auVar25._8_8_ = 0;
      auVar25._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      auVar3 = vfmadd231sd_fma(auVar3,auVar77,auVar25);
      local_90.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
      _0_8_ = auVar89._0_8_;
      local_90.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
      _8_8_ = auVar2._0_8_;
      local_90.
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
      _16_8_ = auVar3._0_8_;
      iVar52 = (*(pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])()
      ;
      ChVariables::Get_fb(&local_40,(ChVariables *)CONCAT44(extraout_var_02,iVar52));
      if ((long)local_40.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ._8_8_ < 6) goto LAB_0058be27;
      uVar54 = local_40.
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               ._0_8_ + 0x18;
      uVar53 = 3;
      if (((uVar54 & 7) == 0) &&
         (uVar55 = (ulong)(-((uint)(uVar54 >> 3) & 0x1fffffff) & 7), uVar55 < 3)) {
        uVar53 = uVar55;
      }
      if (uVar53 != 0) {
        uVar55 = 0;
        do {
          *(double *)(uVar54 + uVar55 * 8) =
               factor * *(double *)
                         (&local_90.
                           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                           .field_0x0 + uVar55 * 8) + *(double *)(uVar54 + uVar55 * 8);
          uVar55 = uVar55 + 1;
        } while (uVar53 != uVar55);
      }
      if (uVar53 < 3) {
        do {
          *(double *)(uVar54 + uVar53 * 8) =
               factor * *(double *)
                         (&local_90.
                           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                           .field_0x0 + uVar53 * 8) + *(double *)(uVar54 + uVar53 * 8);
          uVar53 = uVar53 + 1;
        } while (uVar53 != 3);
      }
    }
    dVar81 = (this->C_torque).m_data[0];
    auVar59._8_8_ = 0;
    auVar59._0_8_ = dVar81;
    dVar1 = (this->C_torque).m_data[1];
    if ((((dVar81 != 0.0) || (NAN(dVar81))) || (dVar1 != 0.0)) ||
       (((NAN(dVar1) || (dVar81 = (this->C_torque).m_data[2], dVar81 != 0.0)) || (NAN(dVar81))))) {
      pCVar50 = (this->super_ChLink).Body2;
      pCVar51 = this->marker2;
      auVar26._8_8_ = 0;
      auVar26._0_8_ =
           (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      auVar71._8_8_ = 0;
      auVar71._0_8_ =
           dVar1 * (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[1];
      auVar89 = vfmadd231sd_fma(auVar71,auVar59,auVar26);
      auVar78._8_8_ = 0;
      auVar78._0_8_ = (this->C_torque).m_data[2];
      auVar27._8_8_ = 0;
      auVar27._0_8_ =
           (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      auVar89 = vfmadd231sd_fma(auVar89,auVar78,auVar27);
      auVar28._8_8_ = 0;
      auVar28._0_8_ =
           (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      auVar86._8_8_ = 0;
      auVar86._0_8_ =
           dVar1 * (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4];
      auVar2 = vfmadd231sd_fma(auVar86,auVar59,auVar28);
      auVar29._8_8_ = 0;
      auVar29._0_8_ =
           (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      auVar2 = vfmadd231sd_fma(auVar2,auVar78,auVar29);
      auVar30._8_8_ = 0;
      auVar30._0_8_ =
           (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      auVar65._8_8_ = 0;
      auVar65._0_8_ =
           dVar1 * (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[7];
      auVar3 = vfmadd231sd_fma(auVar65,auVar59,auVar30);
      auVar31._8_8_ = 0;
      auVar31._0_8_ =
           (pCVar51->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      auVar3 = vfmadd231sd_fma(auVar3,auVar78,auVar31);
      dVar81 = auVar2._0_8_;
      auVar32._8_8_ = 0;
      auVar32._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      auVar79._8_8_ = 0;
      auVar79._0_8_ =
           dVar81 * (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[1];
      auVar2 = vfmadd231sd_fma(auVar79,auVar89,auVar32);
      auVar33._8_8_ = 0;
      auVar33._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      auVar2 = vfmadd231sd_fma(auVar2,auVar3,auVar33);
      auVar34._8_8_ = 0;
      auVar34._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      auVar90._8_8_ = 0;
      auVar90._0_8_ =
           dVar81 * (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[4];
      auVar4 = vfmadd231sd_fma(auVar90,auVar89,auVar34);
      auVar35._8_8_ = 0;
      auVar35._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      auVar4 = vfmadd231sd_fma(auVar4,auVar3,auVar35);
      auVar36._8_8_ = 0;
      auVar36._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      auVar87._8_8_ = 0;
      auVar87._0_8_ =
           dVar81 * (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                    super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[7];
      auVar89 = vfmadd231sd_fma(auVar87,auVar89,auVar36);
      auVar37._8_8_ = 0;
      auVar37._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      auVar89 = vfmadd231sd_fma(auVar89,auVar3,auVar37);
      pCVar50 = (this->super_ChLink).Body1;
      local_50 = auVar4._0_8_;
      auVar38._8_8_ = 0;
      auVar38._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      auVar60._8_8_ = 0;
      auVar60._0_8_ =
           local_50 *
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      auVar3 = vfmadd231sd_fma(auVar60,auVar2,auVar38);
      auVar39._8_8_ = 0;
      auVar39._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      auVar3 = vfmadd231sd_fma(auVar3,auVar89,auVar39);
      auVar40._8_8_ = 0;
      auVar40._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      auVar66._8_8_ = 0;
      auVar66._0_8_ =
           local_50 *
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
      auVar4 = vfmadd231sd_fma(auVar66,auVar2,auVar40);
      auVar41._8_8_ = 0;
      auVar41._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
      auVar4 = vfmadd231sd_fma(auVar4,auVar89,auVar41);
      local_48 = auVar2._0_8_;
      auVar42._8_8_ = 0;
      auVar42._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
      auVar72._8_8_ = 0;
      auVar72._0_8_ =
           local_50 *
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      auVar2 = vfmadd231sd_fma(auVar72,auVar2,auVar42);
      local_58 = auVar89._0_8_;
      auVar43._8_8_ = 0;
      auVar43._0_8_ =
           (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
           super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
      auVar89 = vfmadd231sd_fma(auVar2,auVar89,auVar43);
      local_a8.m_data[0] = auVar3._0_8_;
      local_a8.m_data[1] = auVar4._0_8_;
      local_a8.m_data[2] = auVar89._0_8_;
      iVar52 = (*(pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])()
      ;
      ChVariables::Get_fb((ChVectorRef *)&local_78,(ChVariables *)CONCAT44(extraout_var_03,iVar52));
      if (5 < (long)local_78.m_data[1]) {
        uVar54 = (long)local_78.m_data[0] + 0x18;
        uVar53 = 3;
        if (((uVar54 & 7) == 0) &&
           (uVar55 = (ulong)(-((uint)(uVar54 >> 3) & 0x1fffffff) & 7), uVar55 < 3)) {
          uVar53 = uVar55;
        }
        if (uVar53 != 0) {
          uVar55 = 0;
          do {
            *(double *)(uVar54 + uVar55 * 8) =
                 factor * local_a8.m_data[uVar55] + *(double *)(uVar54 + uVar55 * 8);
            uVar55 = uVar55 + 1;
          } while (uVar53 != uVar55);
        }
        if (uVar53 < 3) {
          do {
            *(double *)(uVar54 + uVar53 * 8) =
                 factor * local_a8.m_data[uVar53] + *(double *)(uVar54 + uVar53 * 8);
            uVar53 = uVar53 + 1;
          } while (uVar53 != 3);
        }
        pCVar50 = (this->super_ChLink).Body2;
        auVar80._8_8_ = 0;
        auVar80._0_8_ = local_48;
        auVar44._8_8_ = 0;
        auVar44._0_8_ =
             (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
             super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
        auVar61._8_8_ = 0;
        auVar61._0_8_ =
             local_50 *
             (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
             super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
        auVar89 = vfmadd231sd_fma(auVar61,auVar80,auVar44);
        auVar88._8_8_ = 0;
        auVar88._0_8_ = local_58;
        auVar45._8_8_ = 0;
        auVar45._0_8_ =
             (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
             super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
        auVar89 = vfmadd231sd_fma(auVar89,auVar88,auVar45);
        auVar46._8_8_ = 0;
        auVar46._0_8_ =
             (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
             super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
        auVar67._8_8_ = 0;
        auVar67._0_8_ =
             local_50 *
             (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
             super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
        auVar2 = vfmadd231sd_fma(auVar67,auVar80,auVar46);
        auVar47._8_8_ = 0;
        auVar47._0_8_ =
             (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
             super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
        auVar2 = vfmadd231sd_fma(auVar2,auVar88,auVar47);
        auVar48._8_8_ = 0;
        auVar48._0_8_ =
             (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
             super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
        auVar73._8_8_ = 0;
        auVar73._0_8_ =
             local_50 *
             (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
             super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
        auVar3 = vfmadd231sd_fma(auVar73,auVar80,auVar48);
        auVar49._8_8_ = 0;
        auVar49._0_8_ =
             (pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
             super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
        auVar3 = vfmadd231sd_fma(auVar3,auVar88,auVar49);
        local_a8.m_data[0] = auVar89._0_8_;
        local_a8.m_data[1] = auVar2._0_8_;
        local_a8.m_data[2] = auVar3._0_8_;
        iVar52 = (*(pCVar50->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])
                           ();
        ChVariables::Get_fb((ChVectorRef *)&local_78,(ChVariables *)CONCAT44(extraout_var_04,iVar52)
                           );
        if (5 < (long)local_78.m_data[1]) {
          uVar54 = (long)local_78.m_data[0] + 0x18;
          uVar53 = 3;
          if (((uVar54 & 7) == 0) &&
             (uVar55 = (ulong)(-((uint)(uVar54 >> 3) & 0x1fffffff) & 7), uVar55 < 3)) {
            uVar53 = uVar55;
          }
          if (uVar53 != 0) {
            uVar55 = 0;
            do {
              *(double *)(uVar54 + uVar55 * 8) =
                   *(double *)(uVar54 + uVar55 * 8) - factor * local_a8.m_data[uVar55];
              uVar55 = uVar55 + 1;
            } while (uVar53 != uVar55);
          }
          if (2 < uVar53) {
            return;
          }
          do {
            *(double *)(uVar54 + uVar53 * 8) =
                 *(double *)(uVar54 + uVar53 * 8) - factor * local_a8.m_data[uVar53];
            uVar53 = uVar53 + 1;
          } while (uVar53 != 3);
          return;
        }
      }
LAB_0058be27:
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                    "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                   );
    }
  }
  return;
}

Assistant:

void ChLinkMarkers::ConstraintsFbLoadForces(double factor) {
    if (!Body1 || !Body2)
        return;

    if (Vnotnull(C_force)) {
        Vector mbody_force;
        Vector mbody_torque;
        Vector m_abs_force = Body2->GetA() * (marker2->GetA() * C_force);

        Body2->To_abs_forcetorque(m_abs_force,
                                  marker1->GetAbsCoord().pos,  // absolute application point is always marker1
                                  false,                       // from abs. space
                                  mbody_force, mbody_torque);  // resulting force-torque, both in abs coords
        Body2->Variables().Get_fb().segment(0, 3) -= factor * mbody_force.eigen();
        Body2->Variables().Get_fb().segment(3, 3) -=
            factor * Body2->TransformDirectionParentToLocal(mbody_torque).eigen();

        Body1->To_abs_forcetorque(m_abs_force,
                                  marker1->GetAbsCoord().pos,  // absolute application point is always marker1
                                  false,                       // from abs. space
                                  mbody_force, mbody_torque);  // resulting force-torque, both in abs coords
        Body1->Variables().Get_fb().segment(0, 3) += factor * mbody_force.eigen();
        Body1->Variables().Get_fb().segment(3, 3) +=
            factor * Body1->TransformDirectionParentToLocal(mbody_torque).eigen();
    }

    if (Vnotnull(C_torque)) {
        Vector m_abs_torque = Body2->GetA() * (marker2->GetA() * C_torque);
        // load torques in 'fb' vector accumulator of body variables (torques in local coords)
        Body1->Variables().Get_fb().segment(3, 3) +=
            factor * Body1->TransformDirectionParentToLocal(m_abs_torque).eigen();
        Body2->Variables().Get_fb().segment(3, 3) -=
            factor * Body2->TransformDirectionParentToLocal(m_abs_torque).eigen();
    }
}